

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite33_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite33_Test<absl::lts_20250127::Cord> *this)

{
  bool bVar1;
  int *rhs;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  string_view data_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string data;
  TestMapLite message;
  AssertHelper local_2d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  AssertHelper local_298;
  long *local_290;
  size_t local_288;
  long local_280 [2];
  TestMapLite local_270;
  
  proto2_unittest::TestMapLite::TestMapLite(&local_270,(Arena *)0x0);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\n\x04\b\x01\x10\x01","");
  data_00._M_str = (char *)local_290;
  data_00._M_len = local_288;
  bVar1 = MessageLite::ParseFromString(&local_270.super_MessageLite,data_00);
  local_2c8._M_head_impl._0_1_ = bVar1;
  local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b8,(internal *)&local_2c8,
               (AssertionResult *)"message.ParseFromString(data)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2fb,(char *)CONCAT71(local_2b8._1_7_,local_2b8[0]));
    testing::internal::AssertHelper::operator=(&local_298,(Message *)&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2b8._1_7_,local_2b8[0]) != &local_2a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2b8._1_7_,local_2b8[0]),local_2a8._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 8))();
    }
  }
  if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,local_2c0);
  }
  local_2d0.data_._0_4_ = 1;
  local_2c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)(uint)local_270.field_0._0_4_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_2b8,"1","message.map_int32_int32().size()",(int *)&local_2d0,
             (unsigned_long *)&local_2c8);
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2c8);
    if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_2b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2fc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2c8);
  }
  else {
    if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2b0,local_2b0);
    }
    local_2c8._M_head_impl._0_4_ = 1;
    local_2d0.data_._0_4_ = 1;
    rhs = Map<int,_int>::at<int>
                    ((Map<int,_int> *)&local_270.field_0._impl_,(key_arg<int> *)&local_2d0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2b8,"1","message.map_int32_int32().at(1)",(int *)&local_2c8,rhs);
    if (local_2b8[0] != (internal)0x0) goto LAB_00171c11;
    testing::Message::Message((Message *)&local_2c8);
    if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_2b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
               ,0x2fd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_2c8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_2d0);
  if (local_2c8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_2c8._M_head_impl + 8))();
  }
LAB_00171c11:
  if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2b0,local_2b0);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  proto2_unittest::TestMapLite::~TestMapLite(&local_270);
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite33) {
  {
    // StandardWireFormat
    proto2_unittest::TestMapLite message;
    std::string data = "\x0A\x04\x08\x01\x10\x01";

    EXPECT_TRUE(message.ParseFromString(data));
    ASSERT_EQ(1, message.map_int32_int32().size());
    EXPECT_EQ(1, message.map_int32_int32().at(1));
  }
}